

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::handle_leave_cluster_resp(raft_server *this,resp_msg *resp)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  resp_msg *in_RSI;
  long in_RDI;
  int32 in_stack_0000019c;
  raft_server *in_stack_000001a0;
  string local_60 [48];
  string local_30 [32];
  resp_msg *local_10;
  
  local_10 = in_RSI;
  bVar1 = resp_msg::get_accepted(in_RSI);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2f8025);
      iVar2 = (*peVar3->_vptr_logger[7])();
      if (4 < iVar2) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2f8048);
        msg_if_given_abi_cxx11_
                  ((char *)local_60,
                   "peer accepted to stepping down, removing this server from cluster");
        (*peVar3->_vptr_logger[8])
                  (peVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_leave_cluster_resp",0x1db,local_60);
        std::__cxx11::string::~string(local_60);
      }
    }
    msg_base::get_src(&local_10->super_msg_base);
    rm_srv_from_cluster(in_stack_000001a0,in_stack_0000019c);
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2f7f5e);
      iVar2 = (*peVar3->_vptr_logger[7])();
      if (4 < iVar2) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2f7f81);
        msg_if_given_abi_cxx11_
                  ((char *)local_30,"peer doesn\'t accept to stepping down, stop proceeding");
        (*peVar3->_vptr_logger[8])
                  (peVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_leave_cluster_resp",0x1d7,local_30);
        std::__cxx11::string::~string(local_30);
      }
    }
  }
  return;
}

Assistant:

void raft_server::handle_leave_cluster_resp(resp_msg& resp) {
    if (!resp.get_accepted()) {
        p_db("peer doesn't accept to stepping down, stop proceeding");
        return;
    }

    p_db("peer accepted to stepping down, removing this server from cluster");
    rm_srv_from_cluster(resp.get_src());
}